

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  ulong uVar5;
  JSAMPROW pJVar6;
  
  uVar1 = cinfo->output_width;
  while (0 < num_rows) {
    num_rows = num_rows + -1;
    pJVar2 = (*input_buf)[input_row];
    pJVar3 = input_buf[1][input_row];
    pJVar4 = input_buf[2][input_row];
    input_row = input_row + 1;
    pJVar6 = *output_buf;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      *pJVar6 = pJVar2[uVar5];
      pJVar6[1] = pJVar3[uVar5];
      pJVar6[2] = pJVar4[uVar5];
      pJVar6 = pJVar6 + 3;
    }
    output_buf = output_buf + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_convert (j_decompress_ptr cinfo,
	     JSAMPIMAGE input_buf, JDIMENSION input_row,
	     JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      /* We can dispense with GETJSAMPLE() here */
      outptr[RGB_RED]   = inptr0[col];
      outptr[RGB_GREEN] = inptr1[col];
      outptr[RGB_BLUE]  = inptr2[col];
      outptr += RGB_PIXELSIZE;
    }
  }
}